

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageadapter.h
# Opt level: O3

void __thiscall
bgui::ImageAdapter<unsigned_short>::setSmoothing(ImageAdapter<unsigned_short> *this,bool tf)

{
  pointer pIVar1;
  pointer pIVar2;
  undefined7 in_register_00000031;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *image;
  pointer this_00;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> IStack_58;
  
  if ((int)CONCAT71(in_register_00000031,tf) == 0) {
    pIVar1 = (this->mipmap).
             super__Vector_base<gimage::Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>,_std::allocator<gimage::Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pIVar2 = (this->mipmap).
             super__Vector_base<gimage::Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>,_std::allocator<gimage::Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    this_00 = pIVar1;
    if (pIVar2 != pIVar1) {
      do {
        gimage::Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::~Image(this_00);
        this_00 = this_00 + 1;
      } while (this_00 != pIVar2);
      (this->mipmap).
      super__Vector_base<gimage::Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>,_std::allocator<gimage::Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pIVar1;
    }
  }
  else if ((((this->mipmap).
             super__Vector_base<gimage::Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>,_std::allocator<gimage::Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish ==
             (this->mipmap).
             super__Vector_base<gimage::Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>,_std::allocator<gimage::Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start) &&
           (image = this->image, 0x40 < image->width)) && (0x40 < image->height)) {
    do {
      gimage::downscaleImage<unsigned_short>(&IStack_58,image,2);
      std::
      vector<gimage::Image<unsigned_short,gimage::PixelTraits<unsigned_short>>,std::allocator<gimage::Image<unsigned_short,gimage::PixelTraits<unsigned_short>>>>
      ::emplace_back<gimage::Image<unsigned_short,gimage::PixelTraits<unsigned_short>>>
                ((vector<gimage::Image<unsigned_short,gimage::PixelTraits<unsigned_short>>,std::allocator<gimage::Image<unsigned_short,gimage::PixelTraits<unsigned_short>>>>
                  *)&this->mipmap,&IStack_58);
      gimage::Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::~Image(&IStack_58);
      pIVar1 = (this->mipmap).
               super__Vector_base<gimage::Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>,_std::allocator<gimage::Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pIVar1[-1].width < 0x41) {
        return;
      }
      image = pIVar1 + -1;
    } while (0x40 < pIVar1[-1].height);
  }
  return;
}

Assistant:

void setSmoothing(bool tf)
    {
      if (tf && mipmap.size() == 0)
      {
        const gimage::Image<T> *p=image;
        long w=p->getWidth();
        long h=p->getHeight();

        while (w > 64 && h > 64)
        {
          mipmap.push_back(downscaleImage(*p, 2));

          p=&mipmap.back();
          w=p->getWidth();
          h=p->getHeight();
        }
      }
      else if (!tf)
      {
        mipmap.clear();
      }
    }